

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_engine_base.cpp
# Opt level: O2

void __thiscall
zmq::stream_engine_base_t::plug
          (stream_engine_base_t *this,io_thread_t *io_thread_,session_base_t *session_)

{
  socket_base_t *psVar1;
  handle_t pvVar2;
  
  if (this->_plugged == true) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!_plugged",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_engine_base.cpp"
            ,0xb6);
    fflush(_stderr);
    zmq_abort("!_plugged");
  }
  this->_plugged = true;
  if (this->_session != (session_base_t *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!_session",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_engine_base.cpp"
            ,0xba);
    fflush(_stderr);
    zmq_abort("!_session");
  }
  if (session_ == (session_base_t *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","session_",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_engine_base.cpp"
            ,0xbb);
    fflush(_stderr);
    zmq_abort("session_");
  }
  this->_session = session_;
  psVar1 = session_base_t::get_socket(session_);
  this->_socket = psVar1;
  io_object_t::plug(&this->super_io_object_t,io_thread_);
  pvVar2 = io_object_t::add_fd(&this->super_io_object_t,this->_s);
  this->_handle = pvVar2;
  this->_io_error = false;
  (*(this->super_io_object_t).super_i_poll_events._vptr_i_poll_events[0xf])(this);
  return;
}

Assistant:

void zmq::stream_engine_base_t::plug (io_thread_t *io_thread_,
                                      session_base_t *session_)
{
    zmq_assert (!_plugged);
    _plugged = true;

    //  Connect to session object.
    zmq_assert (!_session);
    zmq_assert (session_);
    _session = session_;
    _socket = _session->get_socket ();

    //  Connect to I/O threads poller object.
    io_object_t::plug (io_thread_);
    _handle = add_fd (_s);
    _io_error = false;

    plug_internal ();
}